

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O3

pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
winmd::reader::parse_array_sizes
          (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,table_base *param_1,byte_view *data)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t *puVar3;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *ppVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  uint local_80;
  uint local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  string local_58;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *local_38;
  
  pbVar5 = data->m_first;
  local_80 = (uint)*pbVar5;
  uVar9 = 1;
  if ((char)*pbVar5 < '\0') {
    if ((local_80 & 0xffffffc0) == 0x80) {
      pbVar6 = pbVar5 + 1;
      local_80 = (local_80 & 0x3f) << 8;
      uVar7 = 2;
    }
    else {
      if ((local_80 & 0xffffffe0) != 0xc0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Invalid compressed integer in blob","");
        impl::throw_invalid(&local_58);
      }
      pbVar6 = pbVar5 + 3;
      local_80 = (uint)pbVar5[2] << 8 | (uint)pbVar5[1] << 0x10 | (local_80 & 0x1f) << 0x18;
      uVar7 = 4;
    }
    local_80 = *pbVar6 | local_80;
  }
  else {
    uVar7 = 1;
  }
  byte_view::check_available(data,uVar7);
  puVar3 = data->m_first;
  puVar1 = puVar3 + uVar7;
  data->m_first = puVar1;
  bVar2 = puVar3[uVar7];
  uVar7 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    uVar9 = (uint)bVar2;
    if ((uVar7 & 0xffffffc0) == 0x80) {
      pbVar5 = puVar1 + 1;
      uVar7 = (uVar9 & 0x3f) << 8;
      uVar9 = 2;
    }
    else {
      if ((uVar9 & 0xffffffe0) != 0xc0) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Invalid compressed integer in blob","");
        impl::throw_invalid(&local_58);
      }
      pbVar5 = puVar1 + 3;
      uVar7 = (uint)puVar1[2] << 8 | (uint)puVar1[1] << 0x10 | (uVar9 & 0x1f) << 0x18;
      uVar9 = 4;
    }
    uVar7 = *pbVar5 | uVar7;
  }
  byte_view::check_available(data,uVar9);
  data->m_first = data->m_first + uVar9;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_78,(ulong)uVar7);
  local_38 = __return_storage_ptr__;
  if (uVar7 != 0) {
    do {
      pbVar5 = data->m_first;
      bVar2 = *pbVar5;
      uVar9 = (uint)bVar2;
      uVar8 = 1;
      if ((char)bVar2 < '\0') {
        uVar8 = (uint)bVar2;
        if ((uVar9 & 0xffffffc0) == 0x80) {
          pbVar6 = pbVar5 + 1;
          uVar9 = (uVar8 & 0x3f) << 8;
          uVar8 = 2;
        }
        else {
          if ((uVar8 & 0xffffffe0) != 0xc0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"Invalid compressed integer in blob","");
            impl::throw_invalid(&local_58);
          }
          pbVar6 = pbVar5 + 3;
          uVar9 = (uint)pbVar5[2] << 8 | (uint)pbVar5[1] << 0x10 | (uVar8 & 0x1f) << 0x18;
          uVar8 = 4;
        }
        uVar9 = *pbVar6 | uVar9;
      }
      byte_view::check_available(data,uVar8);
      data->m_first = data->m_first + uVar8;
      local_7c = uVar9;
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_7c);
      }
      else {
        *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar9;
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  ppVar4 = local_38;
  local_38->first = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38->second,&local_78);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return ppVar4;
}

Assistant:

inline std::pair<uint32_t, std::vector<uint32_t>> parse_array_sizes(table_base const*, byte_view& data)
    {
        uint32_t const rank = uncompress_unsigned(data);
        uint32_t const num_sizes = uncompress_unsigned(data);
        std::vector<uint32_t> sizes;
        sizes.reserve(num_sizes);
        for (uint32_t i = 0; i < num_sizes; ++i)
        {
            auto size = uncompress_unsigned(data);
            sizes.push_back(size);
        }
        return { rank, sizes };
    }